

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O1

int AF_A_RestoreSpecialThing1
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  AInventory *this;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  uint uVar8;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  FSoundID local_2c;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005eb155;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    this = (AInventory *)(param->field_0).field_1.a;
    pVVar9 = param;
    uVar8 = numparam;
    if (this != (AInventory *)0x0) {
      if ((this->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
        (this->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar7 = (this->super_AActor).super_DThinker.super_DObject.Class;
      bVar10 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar10;
      uVar8 = (uint)bVar10;
      pVVar9 = (VMValue *)(ulong)(pPVar7 == pPVar4 || bVar10);
      if (pPVar7 != pPVar4 && !bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005eb155;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005eb12a;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar6 = (**(code **)*puVar3)(puVar3,pVVar9,uVar8,ret);
          puVar3[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar3[1];
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005eb155;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pbVar1 = (byte *)((long)&(this->super_AActor).renderflags.Value + 1);
      *pbVar1 = *pbVar1 & 0x7f;
      AInventory::DoRespawn(this);
      local_2c.ID = S_FindSound("misc/spawn");
      S_Sound((AActor *)this,2,&local_2c,1.0,1.001);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005eb12a:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005eb155:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_pickups.cpp"
                ,0x15e,
                "int AF_A_RestoreSpecialThing1(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RestoreSpecialThing1)
{
	PARAM_ACTION_PROLOGUE;

	self->renderflags &= ~RF_INVISIBLE;
	if (static_cast<AInventory *>(self)->DoRespawn ())
	{
		S_Sound (self, CHAN_VOICE, "misc/spawn", 1, ATTN_IDLE);
	}
	return 0;
}